

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_init.c
# Opt level: O0

int ENGINE_finish(ENGINE *e)

{
  int to_return;
  char *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  uVar1 = 1;
  if (e == (ENGINE *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = CRYPTO_THREAD_write_lock((CRYPTO_RWLOCK *)CONCAT44(1,in_stack_ffffffffffffffe8));
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = engine_unlocked_finish((ENGINE *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),0);
      CRYPTO_THREAD_unlock((CRYPTO_RWLOCK *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
      if (iVar2 == 0) {
        ERR_new();
        ERR_set_debug(unaff_retaddr,in_stack_fffffffffffffffc,(char *)e);
        ERR_set_error(0x26,0x6a,(char *)0x0);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int ENGINE_finish(ENGINE *e)
{
    int to_return = 1;

    if (e == NULL)
        return 1;
    if (!CRYPTO_THREAD_write_lock(global_engine_lock))
        return 0;
    to_return = engine_unlocked_finish(e, 1);
    CRYPTO_THREAD_unlock(global_engine_lock);
    if (!to_return) {
        ERR_raise(ERR_LIB_ENGINE, ENGINE_R_FINISH_FAILED);
        return 0;
    }
    return to_return;
}